

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

void __thiscall
testing::internal::GoogleTestFailureException::GoogleTestFailureException
          (GoogleTestFailureException *this,TestPartResult *failure)

{
  TestPartResult *in_RDX;
  string local_30;
  
  PrintTestPartResultToString_abi_cxx11_(&local_30,(internal *)failure,in_RDX);
  std::runtime_error::runtime_error(&this->super_runtime_error,local_30._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  *(undefined ***)this = &PTR__runtime_error_00168938;
  return;
}

Assistant:

GoogleTestFailureException::GoogleTestFailureException(
    const TestPartResult& failure)
    : ::std::runtime_error(PrintTestPartResultToString(failure).c_str()) {}